

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int pps_range_extensions(GetBitContext *gb,HEVCPPS *pps)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int local_44;
  int i;
  HEVCPPS *pps_local;
  GetBitContext *gb_local;
  uint local_24;
  uint8_t result_1;
  uint32_t index_1;
  uint local_14;
  uint8_t result;
  uint32_t index;
  
  if (pps->transform_skip_enabled_flag != '\0') {
    uVar3 = get_ue_golomb_long(gb);
    pps->log2_max_transform_skip_block_size = (char)uVar3 + '\x02';
  }
  local_14 = gb->index;
  uVar1 = gb->buffer[local_14 >> 3];
  bVar2 = (byte)local_14;
  if (gb->index < gb->size_in_bits_plus8) {
    local_14 = local_14 + 1;
  }
  gb->index = local_14;
  pps->cross_component_prediction_enabled_flag =
       (uint8_t)((int)(uint)(byte)(uVar1 << (bVar2 & 7)) >> 7);
  local_24 = gb->index;
  uVar1 = gb->buffer[local_24 >> 3];
  bVar2 = (byte)local_24;
  if (gb->index < gb->size_in_bits_plus8) {
    local_24 = local_24 + 1;
  }
  gb->index = local_24;
  pps->chroma_qp_offset_list_enabled_flag = (uint8_t)((int)(uint)(byte)(uVar1 << (bVar2 & 7)) >> 7);
  if (pps->chroma_qp_offset_list_enabled_flag != '\0') {
    uVar3 = get_ue_golomb_long(gb);
    pps->diff_cu_chroma_qp_offset_depth = (uint8_t)uVar3;
    uVar3 = get_ue_golomb_long(gb);
    pps->chroma_qp_offset_list_len_minus1 = (uint8_t)uVar3;
    if ((pps->chroma_qp_offset_list_len_minus1 != '\0') &&
       (4 < pps->chroma_qp_offset_list_len_minus1)) {
      fprintf(_stderr,"chroma_qp_offset_list_len_minus1 shall be in the range [0, 5].\n");
      return -1;
    }
    for (local_44 = 0; local_44 <= (int)(uint)pps->chroma_qp_offset_list_len_minus1;
        local_44 = local_44 + 1) {
      iVar4 = get_se_golomb_long(gb);
      pps->cb_qp_offset_list[local_44] = (int8_t)iVar4;
      if (pps->cb_qp_offset_list[local_44] != '\0') {
        fprintf(_stderr,"cb_qp_offset_list not tested yet.\n");
      }
      iVar4 = get_se_golomb_long(gb);
      pps->cr_qp_offset_list[local_44] = (int8_t)iVar4;
      if (pps->cr_qp_offset_list[local_44] != '\0') {
        fprintf(_stderr,"cb_qp_offset_list not tested yet.\n");
      }
    }
  }
  uVar3 = get_ue_golomb_long(gb);
  pps->log2_sao_offset_scale_luma = (uint8_t)uVar3;
  uVar3 = get_ue_golomb_long(gb);
  pps->log2_sao_offset_scale_chroma = (uint8_t)uVar3;
  return 0;
}

Assistant:

static int pps_range_extensions(GetBitContext *gb, HEVCPPS *pps)
{
    int i;

    if (pps->transform_skip_enabled_flag)
        pps->log2_max_transform_skip_block_size = (uint8_t)(get_ue_golomb_long(gb) + 2);
    pps->cross_component_prediction_enabled_flag = (uint8_t)get_bits1(gb);
    pps->chroma_qp_offset_list_enabled_flag = (uint8_t)get_bits1(gb);
    if (pps->chroma_qp_offset_list_enabled_flag) {
        pps->diff_cu_chroma_qp_offset_depth = (uint8_t)get_ue_golomb_long(gb);
        pps->chroma_qp_offset_list_len_minus1 = (uint8_t)get_ue_golomb_long(gb);
        if (pps->chroma_qp_offset_list_len_minus1 && pps->chroma_qp_offset_list_len_minus1 >= 5)
        {
            fprintf(stderr, "chroma_qp_offset_list_len_minus1 shall be in the range [0, 5].\n");
            return -1;
        }
        for (i = 0; i <= pps->chroma_qp_offset_list_len_minus1; i++)
        {
            pps->cb_qp_offset_list[i] = (int8_t)get_se_golomb_long(gb);
            if (pps->cb_qp_offset_list[i])
                fprintf(stderr, "cb_qp_offset_list not tested yet.\n");
            pps->cr_qp_offset_list[i] = (int8_t)get_se_golomb_long(gb);
            if (pps->cr_qp_offset_list[i])
                fprintf(stderr, "cb_qp_offset_list not tested yet.\n");
        }
    }
    pps->log2_sao_offset_scale_luma = (uint8_t)get_ue_golomb_long(gb);
    pps->log2_sao_offset_scale_chroma = (uint8_t)get_ue_golomb_long(gb);

    return 0;
}